

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analysis.cpp
# Opt level: O1

void KillComponent(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
                   *components,string *str)

{
  mapped_type pCVar1;
  mapped_type *ppCVar2;
  _Hash_node_base *p_Var3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
  *__range2;
  Component *target;
  mapped_type local_30;
  
  ppCVar2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)components,str);
  local_30 = *ppCVar2;
  if (local_30 != (mapped_type)0x0) {
    p_Var3 = (components->_M_h)._M_before_begin._M_nxt;
    if (p_Var3 != (_Hash_node_base *)0x0) {
      do {
        std::
        _Hashtable<Component_*,_Component_*,_std::allocator<Component_*>,_std::__detail::_Identity,_std::equal_to<Component_*>,_std::hash<Component_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_erase((_Hashtable<Component_*,_Component_*,_std::allocator<Component_*>,_std::__detail::_Identity,_std::equal_to<Component_*>,_std::hash<Component_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)(p_Var3[5]._M_nxt + 8),&local_30);
        std::
        _Hashtable<Component_*,_Component_*,_std::allocator<Component_*>,_std::__detail::_Identity,_std::equal_to<Component_*>,_std::hash<Component_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_erase((_Hashtable<Component_*,_Component_*,_std::allocator<Component_*>,_std::__detail::_Identity,_std::equal_to<Component_*>,_std::hash<Component_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)(p_Var3[5]._M_nxt + 0xf),&local_30);
        std::
        _Hashtable<Component_*,_Component_*,_std::allocator<Component_*>,_std::__detail::_Identity,_std::equal_to<Component_*>,_std::hash<Component_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::clear((_Hashtable<Component_*,_Component_*,_std::allocator<Component_*>,_std::__detail::_Identity,_std::equal_to<Component_*>,_std::hash<Component_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)(p_Var3[5]._M_nxt + 0x24));
        p_Var3 = p_Var3->_M_nxt;
      } while (p_Var3 != (_Hash_node_base *)0x0);
    }
    pCVar1 = local_30;
    if (local_30 != (Component *)0x0) {
      Component::~Component(local_30);
      operator_delete(pCVar1);
    }
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_erase(&components->_M_h,str);
  return;
}

Assistant:

void KillComponent(std::unordered_map<std::string, Component *> &components, const std::string& str) {
  Component* target = components[str];
  if (target) {
    for (auto& c : components) {
      c.second->pubDeps.erase(target);
      c.second->privDeps.erase(target);
      c.second->circulars.clear();
    }
    delete target;
  }
  components.erase(str);
}